

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-decimal128.c
# Opt level: O0

void test_decimal128_from_string__invalid_inputs(void)

{
  undefined1 local_18 [8];
  bson_decimal128_t dec;
  
  bson_decimal128_from_string(".",local_18);
  if (dec.low != 0x7c00000000000000) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x114,"test_decimal128_from_string__invalid_inputs","IS_NAN (dec)");
    abort();
  }
  bson_decimal128_from_string(".e",local_18);
  if (dec.low != 0x7c00000000000000) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x116,"test_decimal128_from_string__invalid_inputs","IS_NAN (dec)");
    abort();
  }
  bson_decimal128_from_string("",local_18);
  if (dec.low != 0x7c00000000000000) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x118,"test_decimal128_from_string__invalid_inputs","IS_NAN (dec)");
    abort();
  }
  bson_decimal128_from_string("invalid",local_18);
  if (dec.low != 0x7c00000000000000) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x11a,"test_decimal128_from_string__invalid_inputs","IS_NAN (dec)");
    abort();
  }
  bson_decimal128_from_string("in",local_18);
  if (dec.low != 0x7c00000000000000) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x11c,"test_decimal128_from_string__invalid_inputs","IS_NAN (dec)");
    abort();
  }
  bson_decimal128_from_string("i",local_18);
  if (dec.low != 0x7c00000000000000) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x11e,"test_decimal128_from_string__invalid_inputs","IS_NAN (dec)");
    abort();
  }
  bson_decimal128_from_string("E02",local_18);
  if (dec.low != 0x7c00000000000000) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x120,"test_decimal128_from_string__invalid_inputs","IS_NAN (dec)");
    abort();
  }
  bson_decimal128_from_string("..1",local_18);
  if (dec.low != 0x7c00000000000000) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x122,"test_decimal128_from_string__invalid_inputs","IS_NAN (dec)");
    abort();
  }
  bson_decimal128_from_string("1abcede",local_18);
  if (dec.low != 0x7c00000000000000) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x124,"test_decimal128_from_string__invalid_inputs","IS_NAN (dec)");
    abort();
  }
  bson_decimal128_from_string("1.24abc",local_18);
  if (dec.low != 0x7c00000000000000) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x126,"test_decimal128_from_string__invalid_inputs","IS_NAN (dec)");
    abort();
  }
  bson_decimal128_from_string("1.24abcE+02",local_18);
  if (dec.low != 0x7c00000000000000) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x128,"test_decimal128_from_string__invalid_inputs","IS_NAN (dec)");
    abort();
  }
  bson_decimal128_from_string("1.24E+02abc2d",local_18);
  if (dec.low != 0x7c00000000000000) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x12a,"test_decimal128_from_string__invalid_inputs","IS_NAN (dec)");
    abort();
  }
  bson_decimal128_from_string("E+02",local_18);
  if (dec.low != 0x7c00000000000000) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,300,"test_decimal128_from_string__invalid_inputs","IS_NAN (dec)");
    abort();
  }
  bson_decimal128_from_string("e+02",local_18);
  if (dec.low != 0x7c00000000000000) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
            ,0x12e,"test_decimal128_from_string__invalid_inputs","IS_NAN (dec)");
    abort();
  }
  return;
}

Assistant:

static void
test_decimal128_from_string__invalid_inputs (void)
{
   bson_decimal128_t dec;

   bson_decimal128_from_string (".", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string (".e", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("invalid", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("in", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("i", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("E02", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("..1", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("1abcede", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("1.24abc", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("1.24abcE+02", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("1.24E+02abc2d", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("E+02", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("e+02", &dec);
   BSON_ASSERT (IS_NAN (dec));
}